

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsql_sqlite.cpp
# Opt level: O3

int qGetColumnType(QString *tpName)

{
  char16_t *pcVar1;
  char cVar2;
  byte bVar3;
  char *pcVar4;
  qsizetype qVar5;
  int iVar6;
  qsizetype qVar7;
  long in_FS_OFFSET;
  QStringView QVar8;
  QStringView QVar9;
  QLatin1String QVar10;
  QStringView QVar11;
  QStringView QVar12;
  QStringView QVar13;
  QLatin1String QVar14;
  QLatin1String QVar15;
  QLatin1String QVar16;
  QLatin1String QVar17;
  QLatin1String QVar18;
  QString local_38;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_38.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_38.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_38.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  QString::toLower_helper(&local_38);
  switch(local_38.d.size) {
  case 3:
    pcVar4 = "int";
    qVar7 = 3;
    qVar5 = 3;
    goto LAB_001122fd;
  case 4:
    pcVar4 = "real";
    qVar7 = 4;
    qVar5 = 4;
    break;
  case 5:
    pcVar4 = "float";
    qVar7 = 5;
    qVar5 = 5;
    break;
  case 6:
    pcVar4 = "double";
    qVar7 = 6;
    qVar5 = 6;
    break;
  case 7:
    pcVar4 = "integer";
    qVar7 = 7;
    qVar5 = 7;
LAB_001122fd:
    QVar8.m_data = local_38.d.ptr;
    QVar8.m_size = qVar7;
    QVar14.m_data = pcVar4;
    QVar14.m_size = qVar5;
    cVar2 = QtPrivate::equalStrings(QVar8,QVar14);
    iVar6 = 2;
    goto LAB_00112359;
  default:
    goto switchD_001122cc_default;
  }
  QVar9.m_data = local_38.d.ptr;
  QVar9.m_size = qVar7;
  QVar15.m_data = pcVar4;
  QVar15.m_size = qVar5;
  cVar2 = QtPrivate::equalStrings(QVar9,QVar15);
  iVar6 = 6;
LAB_00112359:
  if (cVar2 == '\0') {
switchD_001122cc_default:
    QVar10.m_data = (char *)0x7;
    QVar10.m_size = (qsizetype)&local_38;
    cVar2 = QString::startsWith(QVar10,0x1ff649);
    pcVar1 = local_38.d.ptr;
    iVar6 = 6;
    if (cVar2 == '\0') {
      if ((undefined1 *)local_38.d.size == (undefined1 *)0x7) {
        QVar13.m_data = local_38.d.ptr;
        QVar13.m_size = 7;
        QVar18.m_data = "boolean";
        QVar18.m_size = 7;
        cVar2 = QtPrivate::equalStrings(QVar13,QVar18);
        iVar6 = 1;
        if (cVar2 != '\0') goto LAB_0011240d;
      }
      else if ((undefined1 *)local_38.d.size == (undefined1 *)0x4) {
        QVar11.m_data = local_38.d.ptr;
        QVar11.m_size = 4;
        QVar16.m_data = "blob";
        QVar16.m_size = 4;
        cVar2 = QtPrivate::equalStrings(QVar11,QVar16);
        iVar6 = 0xc;
        if (cVar2 == '\0') {
          QVar12.m_data = pcVar1;
          QVar12.m_size = 4;
          QVar17.m_data = "bool";
          QVar17.m_size = 4;
          bVar3 = QtPrivate::equalStrings(QVar12,QVar17);
          iVar6 = (uint)(bVar3 ^ 1) + (uint)(bVar3 ^ 1) * 8 + 1;
        }
        goto LAB_0011240d;
      }
      iVar6 = 10;
    }
  }
LAB_0011240d:
  if (&(local_38.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_38.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_18) {
    __stack_chk_fail();
  }
  return iVar6;
}

Assistant:

static int qGetColumnType(const QString &tpName)
{
    const QString typeName = tpName.toLower();

    if (typeName == "integer"_L1 || typeName == "int"_L1)
        return QMetaType::Int;
    if (typeName == "double"_L1
        || typeName == "float"_L1
        || typeName == "real"_L1
        || typeName.startsWith("numeric"_L1))
        return QMetaType::Double;
    if (typeName == "blob"_L1)
        return QMetaType::QByteArray;
    if (typeName == "boolean"_L1 || typeName == "bool"_L1)
        return QMetaType::Bool;
    return QMetaType::QString;
}